

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O1

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,BindDirectiveSyntax *syntax)

{
  size_t sVar1;
  SyntaxNode *node;
  size_t sVar2;
  uint uVar3;
  Token token;
  
  (this->meta).hasBindDirectives = true;
  sVar1 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
  if (sVar1 != 0) {
    uVar3 = 1;
    sVar1 = 0;
    do {
      node = slang::syntax::SyntaxNode::childNode((SyntaxNode *)syntax,sVar1);
      if (node == (SyntaxNode *)0x0) {
        token = slang::syntax::SyntaxNode::childToken((SyntaxNode *)syntax,sVar1);
        if (token.info != (Info *)0x0) {
          visitToken(this,token);
        }
      }
      else {
        slang::syntax::detail::
        visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
                  (node,this);
      }
      sVar1 = (size_t)uVar3;
      sVar2 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
      uVar3 = uVar3 + 1;
    } while (sVar1 < sVar2);
  }
  return;
}

Assistant:

void handle(const BindDirectiveSyntax& syntax) {
        meta.hasBindDirectives = true;
        visitDefault(syntax);
    }